

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O2

void __thiscall SslTcpSocketImpl::~SslTcpSocketImpl(SslTcpSocketImpl *this)

{
  int iVar1;
  
  (this->super_TcpSocketImpl).super_BaseSocketImpl._vptr_BaseSocketImpl =
       (_func_int **)&PTR__SslTcpSocketImpl_00144df0;
  if (this->m_iSslInit == 1) {
    iVar1 = OpenSSLWrapper::SslConnection::GetShutDownFlag
                      ((this->m_pSslCon)._M_t.
                       super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
    if (iVar1 < 1) {
      OpenSSLWrapper::SslConnection::SSLSetShutdown
                ((this->m_pSslCon)._M_t.
                 super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                 .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl,3);
    }
  }
  std::__cxx11::string::~string((string *)&this->m_strTrustRootCert);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_vProtoList);
  std::_Function_base::~_Function_base(&(this->m_fClientConnectedParam).super__Function_base);
  std::_Function_base::~_Function_base(&(this->m_fClientConnected).super__Function_base);
  std::
  unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>::
  ~unique_ptr(&this->m_pSslCon);
  std::vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>::
  ~vector(&this->m_pServerCtx);
  OpenSSLWrapper::SslContext::~SslContext(&(this->m_pClientCtx).super_SslContext);
  TcpSocketImpl::~TcpSocketImpl(&this->super_TcpSocketImpl);
  return;
}

Assistant:

SslTcpSocketImpl::~SslTcpSocketImpl()
{
    if (m_iSslInit == 1 && m_pSslCon->GetShutDownFlag() < 1)
        m_pSslCon->SSLSetShutdown(SSL_SENT_SHUTDOWN | SSL_RECEIVED_SHUTDOWN);
}